

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O1

int AF_AActor_A_Remove(VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,
                      VMReturn *ret,int numret)

{
  PClassActor *filter;
  PClass *pPVar1;
  int iVar2;
  undefined4 extraout_var;
  PClass *pPVar3;
  VMValue *pVVar4;
  VMValue *pVVar5;
  AActor *pAVar6;
  char *pcVar7;
  bool bVar8;
  FName local_34;
  
  pPVar1 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    pcVar7 = "(paramnum) < numparam";
  }
  else {
    if (((param->field_0).field_3.Type == '\x03') &&
       (((param->field_0).field_1.atag == 1 || ((param->field_0).field_1.a == (void *)0x0)))) {
      pAVar6 = (AActor *)(param->field_0).field_1.a;
      if (pAVar6 != (AActor *)0x0) {
        if ((pAVar6->super_DThinker).super_DObject.Class == (PClass *)0x0) {
          iVar2 = (**(pAVar6->super_DThinker).super_DObject._vptr_DObject)(pAVar6);
          (pAVar6->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar2);
        }
        pPVar3 = (pAVar6->super_DThinker).super_DObject.Class;
        bVar8 = pPVar3 != (PClass *)0x0;
        if (pPVar3 != pPVar1 && bVar8) {
          do {
            pPVar3 = pPVar3->ParentClass;
            bVar8 = pPVar3 != (PClass *)0x0;
            if (pPVar3 == pPVar1) break;
          } while (pPVar3 != (PClass *)0x0);
        }
        if (!bVar8) {
          pcVar7 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_003e07da;
        }
      }
      if (numparam == 1) {
        pcVar7 = "(paramnum) < numparam";
      }
      else {
        if (param[1].field_0.field_3.Type == '\0') {
          if (numparam < 3) {
            pVVar4 = defaultparam->Array;
            if (pVVar4[2].field_0.field_3.Type != '\0') {
              pcVar7 = "(defaultparam[paramnum]).Type == REGT_INT";
              goto LAB_003e07f9;
            }
          }
          else {
            pVVar4 = param;
            if (param[2].field_0.field_3.Type != '\0') {
              pcVar7 = "(param[paramnum]).Type == REGT_INT";
LAB_003e07f9:
              __assert_fail(pcVar7,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                            ,0x18b8,
                            "int AF_AActor_A_Remove(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                           );
            }
          }
          iVar2 = pVVar4[2].field_0.i;
          if (numparam < 4) {
            pVVar4 = defaultparam->Array;
            if ((pVVar4[3].field_0.field_3.Type != '\x03') ||
               ((pVVar5 = pVVar4 + 3, pVVar4[3].field_0.field_1.atag != 1 &&
                ((pVVar5->field_0).field_1.a != (void *)0x0)))) {
              pcVar7 = 
              "(defaultparam[paramnum]).Type == REGT_POINTER && ((defaultparam[paramnum]).atag == ATAG_OBJECT || (defaultparam[paramnum]).a == nullptr)"
              ;
              goto LAB_003e07bb;
            }
          }
          else if ((param[3].field_0.field_3.Type != '\x03') ||
                  ((pVVar5 = param + 3, param[3].field_0.field_1.atag != 1 &&
                   ((pVVar5->field_0).field_1.a != (void *)0x0)))) {
            pcVar7 = 
            "(param[paramnum]).Type == REGT_POINTER && ((param[paramnum]).atag == ATAG_OBJECT || (param[paramnum]).a == nullptr)"
            ;
LAB_003e07bb:
            __assert_fail(pcVar7,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                          ,0x18b9,
                          "int AF_AActor_A_Remove(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                         );
          }
          filter = (PClassActor *)(pVVar5->field_0).field_1.a;
          if (numparam < 5) {
            if (defaultparam->Array[4].field_0.field_3.Type == '\0') goto LAB_003e0744;
            pcVar7 = "(defaultparam[paramnum]).Type == REGT_INT";
          }
          else {
            if (param[4].field_0.field_3.Type == '\0') {
LAB_003e0744:
              pAVar6 = COPY_AAPTR(pAVar6,param[1].field_0.i);
              if (pAVar6 != (AActor *)0x0) {
                DoRemove(pAVar6,iVar2,filter,&local_34);
              }
              return 0;
            }
            pcVar7 = "(param[paramnum]).Type == REGT_INT";
          }
          __assert_fail(pcVar7,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x18ba,
                        "int AF_AActor_A_Remove(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        pcVar7 = "param[paramnum].Type == REGT_INT";
      }
      __assert_fail(pcVar7,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x18b7,
                    "int AF_AActor_A_Remove(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    pcVar7 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
  }
LAB_003e07da:
  __assert_fail(pcVar7,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                ,0x18b6,"int AF_AActor_A_Remove(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
               );
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_Remove)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_INT(removee);
	PARAM_INT_DEF(flags);
	PARAM_CLASS_DEF(filter, AActor);
	PARAM_NAME_DEF(species);

	AActor *reference = COPY_AAPTR(self, removee);
	if (reference != NULL)
	{
		DoRemove(reference, flags, filter, species);
	}
	return 0;
}